

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_string.h
# Opt level: O0

void __thiscall cppcms::xss::details::c_string::c_string(c_string *this,string *other)

{
  long lVar1;
  long lVar2;
  string *in_RSI;
  long *in_RDI;
  
  std::__cxx11::string::string((string *)(in_RDI + 2));
  std::__cxx11::string::operator=((string *)(in_RDI + 2),in_RSI);
  lVar1 = std::__cxx11::string::c_str();
  *in_RDI = lVar1;
  lVar1 = *in_RDI;
  lVar2 = std::__cxx11::string::size();
  in_RDI[1] = lVar1 + lVar2;
  return;
}

Assistant:

explicit c_string(std::string const &other)
				{
					container_ = other;
					begin_ = container_.c_str();
					end_ = begin_ + container_.size();
				}